

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configset.hh
# Opt level: O2

list<bool,_std::allocator<bool>_> * __thiscall
utilmm::config_set::get<std::__cxx11::list<bool,std::allocator<bool>>>
          (list<bool,_std::allocator<bool>_> *__return_storage_ptr__,config_set *this,string *name,
          list<bool,_std::allocator<bool>_> *defval,type *enabler)

{
  bool bVar1;
  const_iterator it;
  _List_node_base *p_Var2;
  stringlist values;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50._M_impl._M_node._M_size = 0;
  local_50._M_impl._M_node.super__List_node_base._M_prev =
       local_50._M_impl._M_node.super__List_node_base._M_next;
  utilmm::config_set::
  get<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)&local_38,(list_conflict *)this,(type *)name);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_50);
  if (local_38._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_38) {
    std::__cxx11::list<bool,_std::allocator<bool>_>::list(__return_storage_ptr__,defval);
  }
  else {
    (__return_storage_ptr__->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node._M_size
         = 0;
    for (p_Var2 = local_38._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 != (_List_node_base *)&local_38; p_Var2 = p_Var2->_M_next) {
      bVar1 = utilmm::config_set::convert<bool>((string *)(p_Var2 + 1));
      local_50._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)
           CONCAT71(local_50._M_impl._M_node.super__List_node_base._M_next._1_7_,bVar1);
      std::__cxx11::list<bool,_std::allocator<bool>_>::push_back
                (__return_storage_ptr__,(value_type_conflict1 *)&local_50);
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_38);
  return __return_storage_ptr__;
}

Assistant:

T config_set::get(std::string const& name, T const& defval,
            typename boost::enable_if< details::is_list<T> >::type *enabler) const
    {
        stringlist values = get< stringlist >(name);
        if (values.empty())
            return defval;

        T result;
        for (stringlist::const_iterator it = values.begin(); it != values.end(); ++it)
            result.push_back(convert<typename T::value_type>(*it));

        return result;
    }